

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_validate.c
# Opt level: O0

int cfg_validate_netaddr
              (autobuf *out,char *section_name,char *entry_name,char *value,_Bool prefix,
              int8_t *af_types,size_t af_types_count)

{
  int iVar1;
  ulong local_80;
  size_t i;
  uint8_t max_prefix;
  netaddr addr;
  int8_t *af_types_local;
  _Bool prefix_local;
  char *value_local;
  char *entry_name_local;
  char *section_name_local;
  autobuf *out_local;
  
  addr._10_8_ = af_types;
  iVar1 = netaddr_from_string((netaddr *)((long)&i + 6),value);
  if (iVar1 == 0) {
    i._5_1_ = netaddr_get_af_maxprefix((uint)addr._addr[8]);
    if (i._5_1_ < addr._addr[9]) {
      cfg_append_printable_line
                (out,"Value \'%s\' for entry \'%s\' in section %s has an illegal prefix length",
                 value,entry_name,section_name);
    }
    else if ((prefix) || (addr._addr[9] == i._5_1_)) {
      for (local_80 = 0; local_80 < af_types_count; local_80 = local_80 + 1) {
        if ((int)*(char *)(addr._10_8_ + local_80) == (uint)addr._addr[8]) {
          return 0;
        }
      }
      cfg_append_printable_line
                (out,"Value \'%s\' for entry \'%s\' in section \'%s\' is wrong address type",value,
                 entry_name,section_name);
    }
    else {
      cfg_append_printable_line
                (out,
                 "Value \'%s\' for entry \'%s\' in section %s must be a single address, not a prefix"
                 ,value,entry_name,section_name);
    }
  }
  else {
    cfg_append_printable_line
              (out,"Value \'%s\' for entry \'%s\' in section %s is no valid network address",value,
               entry_name,section_name);
  }
  return -1;
}

Assistant:

int
cfg_validate_netaddr(struct autobuf *out, const char *section_name, const char *entry_name, const char *value,
  bool prefix, const int8_t *af_types, size_t af_types_count) {
  struct netaddr addr;
  uint8_t max_prefix;
  size_t i;

  if (netaddr_from_string(&addr, value)) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s'"
      " in section %s is no valid network address",
      value, entry_name, section_name);
    return -1;
  }

  max_prefix = netaddr_get_maxprefix(&addr);

  /* check prefix length */
  if (netaddr_get_prefix_length(&addr) > max_prefix) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s'"
      " in section %s has an illegal prefix length",
      value, entry_name, section_name);
    return -1;
  }
  if (!prefix && netaddr_get_prefix_length(&addr) != max_prefix) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s'"
      " in section %s must be a single address, not a prefix",
      value, entry_name, section_name);
    return -1;
  }

  for (i = 0; i < af_types_count; i++) {
    if (af_types[i] == netaddr_get_address_family(&addr)) {
      return 0;
    }
  }

  /* at least one condition was set, but no one matched */
  cfg_append_printable_line(out,
    "Value '%s' for entry '%s'"
    " in section '%s' is wrong address type",
    value, entry_name, section_name);
  return -1;
}